

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psfont.c
# Opt level: O1

void cf2_computeDarkening
               (CF2_F16Dot16 emRatio,CF2_F16Dot16 ppem,CF2_F16Dot16 stemWidth,
               CF2_F16Dot16 *darkenAmount,CF2_F16Dot16 boldenAmount,FT_Bool stemDarkened,
               FT_Int *darkenParams)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  FT_Long FVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined7 in_register_00000089;
  uint uVar13;
  
  *darkenAmount = 0;
  if (emRatio < 0x28f) {
    return;
  }
  if (boldenAmount == 0 && (int)CONCAT71(in_register_00000089,stemDarkened) == 0) {
    return;
  }
  if (stemDarkened == '\0') goto LAB_00210b29;
  iVar10 = *darkenParams;
  iVar1 = darkenParams[6];
  lVar12 = (ulong)(uint)emRatio * (long)(stemWidth + boldenAmount);
  iVar9 = 0x1f;
  uVar13 = (uint)((ulong)(lVar12 + (lVar12 >> 0x3f) + 0x8000) >> 0x10);
  if (uVar13 != 0) {
    for (; uVar13 >> iVar9 == 0; iVar9 = iVar9 + -1) {
    }
  }
  iVar7 = 0x1f;
  if (ppem != 0) {
    for (; (uint)ppem >> iVar7 == 0; iVar7 = iVar7 + -1) {
    }
  }
  if ((uint)(iVar7 + iVar9) < 0x2e) {
    iVar9 = (int)((ulong)(((long)ppem * (long)(int)uVar13 >> 0x3f) + (long)ppem * (long)(int)uVar13
                         + 0x8000) >> 0x10);
  }
  else {
    iVar9 = iVar1 << 0x10;
  }
  iVar7 = darkenParams[1];
  iVar11 = iVar10 * 0x10000;
  if (iVar9 < iVar11) {
    FVar8 = FT_DivFix((long)(iVar7 << 0x10),(ulong)(uint)ppem);
    iVar10 = (int)FVar8;
  }
  else {
    iVar2 = darkenParams[2];
    iVar3 = darkenParams[3];
    iVar4 = darkenParams[4];
    iVar5 = darkenParams[5];
    iVar6 = darkenParams[7];
    if (iVar9 < iVar2 * 0x10000) {
      FVar8 = FT_DivFix((long)iVar11,(ulong)(uint)ppem);
      iVar10 = iVar2 - iVar10;
      if (iVar10 == 0) {
LAB_00210a5a:
        FVar8 = FT_DivFix((long)(iVar2 * 0x10000),(ulong)(uint)ppem);
        if (iVar4 - iVar2 == 0) {
LAB_00210aad:
          FVar8 = FT_DivFix((long)(iVar4 << 0x10),(ulong)(uint)ppem);
          if (iVar1 - iVar4 == 0) goto LAB_00210ac9;
          FVar8 = FT_MulDiv((long)(int)(uVar13 - (int)FVar8),(long)(iVar6 - iVar5),
                            (long)(iVar1 - iVar4));
          iVar10 = (int)FVar8;
          FVar8 = (FT_Long)(iVar5 << 0x10);
        }
        else {
          FVar8 = FT_MulDiv((long)(int)(uVar13 - (int)FVar8),(long)(iVar5 - iVar3),
                            (long)(iVar4 - iVar2));
          iVar10 = (int)FVar8;
          FVar8 = (FT_Long)(iVar3 << 0x10);
        }
      }
      else {
        FVar8 = FT_MulDiv((long)(int)(uVar13 - (int)FVar8),(long)(iVar3 - iVar7),(long)iVar10);
        iVar10 = (int)FVar8;
        FVar8 = (FT_Long)(iVar7 << 0x10);
      }
      FVar8 = FT_DivFix(FVar8,(ulong)(uint)ppem);
      iVar10 = (int)FVar8 + iVar10;
    }
    else {
      if (iVar9 < iVar4 * 0x10000) goto LAB_00210a5a;
      if (iVar9 < iVar1 * 0x10000) goto LAB_00210aad;
LAB_00210ac9:
      FVar8 = FT_DivFix((long)(iVar6 << 0x10),(ulong)(uint)ppem);
      iVar10 = (int)FVar8;
    }
  }
  *darkenAmount = iVar10;
  FVar8 = FT_DivFix((long)iVar10,(ulong)(uint)(emRatio * 2));
  *darkenAmount = (CF2_F16Dot16)FVar8;
LAB_00210b29:
  *darkenAmount = *darkenAmount + boldenAmount / 2;
  return;
}

Assistant:

static void
  cf2_computeDarkening( CF2_Fixed   emRatio,
                        CF2_Fixed   ppem,
                        CF2_Fixed   stemWidth,
                        CF2_Fixed*  darkenAmount,
                        CF2_Fixed   boldenAmount,
                        FT_Bool     stemDarkened,
                        FT_Int*     darkenParams )
  {
    /*
     * Total darkening amount is computed in 1000 unit character space
     * using the modified 5 part curve as Adobe's Avalon rasterizer.
     * The darkening amount is smaller for thicker stems.
     * It becomes zero when the stem is thicker than 2.333 pixels.
     *
     * By default, we use
     *
     *   darkenAmount = 0.4 pixels   if scaledStem <= 0.5 pixels,
     *   darkenAmount = 0.275 pixels if 1 <= scaledStem <= 1.667 pixels,
     *   darkenAmount = 0 pixel      if scaledStem >= 2.333 pixels,
     *
     * and piecewise linear in-between:
     *
     *
     *   darkening
     *       ^
     *       |
     *       |      (x1,y1)
     *       |--------+
     *       |         \
     *       |          \
     *       |           \          (x3,y3)
     *       |            +----------+
     *       |        (x2,y2)         \
     *       |                         \
     *       |                          \
     *       |                           +-----------------
     *       |                         (x4,y4)
     *       +--------------------------------------------->   stem
     *                                                       thickness
     *
     *
     * This corresponds to the following values for the
     * `darkening-parameters' property:
     *
     *   (x1, y1) = (500, 400)
     *   (x2, y2) = (1000, 275)
     *   (x3, y3) = (1667, 275)
     *   (x4, y4) = (2333, 0)
     *
     */

    /* Internal calculations are done in units per thousand for */
    /* convenience. The x axis is scaled stem width in          */
    /* thousandths of a pixel. That is, 1000 is 1 pixel.        */
    /* The y axis is darkening amount in thousandths of a pixel.*/
    /* In the code, below, dividing by ppem and                 */
    /* adjusting for emRatio converts darkenAmount to character */
    /* space (font units).                                      */
    CF2_Fixed  stemWidthPer1000, scaledStem;
    FT_Int     logBase2;


    *darkenAmount = 0;

    if ( boldenAmount == 0 && !stemDarkened )
      return;

    /* protect against range problems and divide by zero */
    if ( emRatio < cf2_doubleToFixed( .01 ) )
      return;

    if ( stemDarkened )
    {
      FT_Int  x1 = darkenParams[0];
      FT_Int  y1 = darkenParams[1];
      FT_Int  x2 = darkenParams[2];
      FT_Int  y2 = darkenParams[3];
      FT_Int  x3 = darkenParams[4];
      FT_Int  y3 = darkenParams[5];
      FT_Int  x4 = darkenParams[6];
      FT_Int  y4 = darkenParams[7];


      /* convert from true character space to 1000 unit character space; */
      /* add synthetic emboldening effect                                */

      /* `stemWidthPer1000' will not overflow for a legitimate font      */

      stemWidthPer1000 = FT_MulFix( stemWidth + boldenAmount, emRatio );

      /* `scaledStem' can easily overflow, so we must clamp its maximum  */
      /* value; the test doesn't need to be precise, but must be         */
      /* conservative.  The clamp value (default 2333) where             */
      /* `darkenAmount' is zero is well below the overflow value of      */
      /* 32767.                                                          */
      /*                                                                 */
      /* FT_MSB computes the integer part of the base 2 logarithm.  The  */
      /* number of bits for the product is 1 or 2 more than the sum of   */
      /* logarithms; remembering that the 16 lowest bits of the fraction */
      /* are dropped this is correct to within a factor of almost 4.     */
      /* For example, 0x80.0000 * 0x80.0000 = 0x4000.0000 is 23+23 and   */
      /* is flagged as possible overflow because 0xFF.FFFF * 0xFF.FFFF = */
      /* 0xFFFF.FE00 is also 23+23.                                      */

      logBase2 = FT_MSB( (FT_UInt32)stemWidthPer1000 ) +
                   FT_MSB( (FT_UInt32)ppem );

      if ( logBase2 >= 46 )
        /* possible overflow */
        scaledStem = cf2_intToFixed( x4 );
      else
        scaledStem = FT_MulFix( stemWidthPer1000, ppem );

      /* now apply the darkening parameters */

      if ( scaledStem < cf2_intToFixed( x1 ) )
        *darkenAmount = FT_DivFix( cf2_intToFixed( y1 ), ppem );

      else if ( scaledStem < cf2_intToFixed( x2 ) )
      {
        FT_Int  xdelta = x2 - x1;
        FT_Int  ydelta = y2 - y1;
        FT_Int  x      = stemWidthPer1000 -
                           FT_DivFix( cf2_intToFixed( x1 ), ppem );


        if ( !xdelta )
          goto Try_x3;

        *darkenAmount = FT_MulDiv( x, ydelta, xdelta ) +
                          FT_DivFix( cf2_intToFixed( y1 ), ppem );
      }

      else if ( scaledStem < cf2_intToFixed( x3 ) )
      {
      Try_x3:
        {
          FT_Int  xdelta = x3 - x2;
          FT_Int  ydelta = y3 - y2;
          FT_Int  x      = stemWidthPer1000 -
                             FT_DivFix( cf2_intToFixed( x2 ), ppem );


          if ( !xdelta )
            goto Try_x4;

          *darkenAmount = FT_MulDiv( x, ydelta, xdelta ) +
                            FT_DivFix( cf2_intToFixed( y2 ), ppem );
        }
      }

      else if ( scaledStem < cf2_intToFixed( x4 ) )
      {
      Try_x4:
        {
          FT_Int  xdelta = x4 - x3;
          FT_Int  ydelta = y4 - y3;
          FT_Int  x      = stemWidthPer1000 -
                             FT_DivFix( cf2_intToFixed( x3 ), ppem );


          if ( !xdelta )
            goto Use_y4;

          *darkenAmount = FT_MulDiv( x, ydelta, xdelta ) +
                            FT_DivFix( cf2_intToFixed( y3 ), ppem );
        }
      }

      else
      {
      Use_y4:
        *darkenAmount = FT_DivFix( cf2_intToFixed( y4 ), ppem );
      }

      /* use half the amount on each side and convert back to true */
      /* character space                                           */
      *darkenAmount = FT_DivFix( *darkenAmount, 2 * emRatio );
    }

    /* add synthetic emboldening effect in character space */
    *darkenAmount += boldenAmount / 2;
  }